

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O2

void pnga_recip(Integer g_a)

{
  long lVar1;
  Integer ndim;
  Integer type;
  Integer hi [7];
  Integer lo [7];
  
  pnga_inquire(g_a,&type,&ndim,hi);
  while (lVar1 = ndim + -1, lVar1 != -1) {
    lo[lVar1] = 1;
    ndim = lVar1;
  }
  _ga_sync_begin = 1;
  gai_oper_elem(g_a,lo,hi,(void *)0x0,2);
  return;
}

Assistant:

void pnga_recip(Integer g_a)
{        
   Integer type, ndim;
   Integer lo[MAXDIM],hi[MAXDIM];
        
    pnga_inquire(g_a,  &type, &ndim, hi);
    while(ndim){
        lo[ndim-1]=1; 
        ndim--;
    }
    _ga_sync_begin = 1; /*just to be on the safe side*/
    gai_oper_elem(g_a, lo, hi, NULL, OP_RECIP);
}